

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O2

void Assimp::IFC::ProcessRevolvedAreaSolid
               (IfcRevolvedAreaSolid *solid,TempMesh *result,ConversionData *conv)

{
  undefined1 *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  double *pdVar1;
  pointer paVar2;
  const_iterator __first;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  IfcProfileDef *pIVar8;
  IfcAxis1Placement *in;
  ulong uVar9;
  ulong uVar10;
  aiMatrix4x4t<double> *paVar11;
  IfcAxis2Placement3D *in_00;
  int iVar12;
  long lVar13;
  long lVar14;
  IfcMatrix4 *pIVar15;
  aiMatrix4x4t<double> *paVar16;
  IfcMatrix4 *pIVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  byte bVar22;
  double dVar23;
  long local_348;
  ulong local_328;
  IfcVector3 pos;
  TempMesh meshout;
  IfcVector3 axis;
  IfcMatrix4 trafo;
  aiMatrix4x4t<double> local_1d0;
  aiVector3t<double> local_150;
  aiMatrix4x4t<double> temp;
  IfcMatrix4 rot;
  
  bVar22 = 0;
  meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  meshout.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  meshout.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  meshout.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this = &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40;
  pIVar8 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::operator*
                     ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)this);
  bVar7 = ProcessProfile(pIVar8,&meshout,conv);
  if (bVar7) {
    if (1 < (ulong)(((long)meshout.mVerts.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)meshout.mVerts.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      axis.x = 0.0;
      axis.y = 0.0;
      axis.z = 0.0;
      pos.x = 0.0;
      pos.y = 0.0;
      pos.z = 0.0;
      in = STEP::Lazy::operator_cast_to_IfcAxis1Placement_
                     ((Lazy *)&(solid->super_IfcSweptAreaSolid).field_0x60);
      ConvertAxisPlacement(&axis,&pos,in);
      dVar6 = pos.z;
      dVar5 = pos.y;
      dVar4 = pos.x;
      local_1d0.a4 = -pos.x;
      local_1d0.b4 = -pos.y;
      local_1d0.c4 = -pos.z;
      local_1d0.a1 = 1.0;
      local_1d0.b1 = 0.0;
      local_1d0.a2 = 0.0;
      local_1d0.a3 = 0.0;
      local_1d0.b2 = 1.0;
      local_1d0.b3 = 0.0;
      local_1d0.c1 = 0.0;
      local_1d0.c2 = 0.0;
      local_1d0.c3 = 1.0;
      local_1d0.d3 = 0.0;
      local_1d0.d1 = 0.0;
      local_1d0.d2 = 0.0;
      local_1d0.d4 = 1.0;
      uVar9 = ((long)meshout.mVerts.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)meshout.mVerts.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18;
      pIVar8 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::operator->
                         ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)this);
      bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(pIVar8->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                               field_0x10,"AREA");
      dVar23 = solid->Angle * conv->angle_scale;
      dVar3 = ABS(dVar23);
      if (0.001 <= dVar3) {
        uVar10 = (ulong)(((double)conv->settings->cylindricalTessellation * dVar3) /
                        1.5707963705062866);
        uVar20 = 2;
        if (2 < (uint)uVar10) {
          uVar20 = uVar10;
        }
        bVar7 = (2 < uVar9 && bVar7) && dVar3 < 6.220353627204895;
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                  (&result->mVerts,((uint)bVar7 * 2 + (int)uVar20 * 4 + 4) * uVar9);
        this_00 = &result->mVertcnt;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (this_00,(uVar20 & 0xffffffff) * uVar9 + 2);
        rot.a1 = 1.0;
        rot.a2 = 0.0;
        rot.a3 = 0.0;
        rot.a4 = 0.0;
        rot.b1 = 0.0;
        rot.b2 = 1.0;
        rot.b3 = 0.0;
        rot.b4 = 0.0;
        rot.c1 = 0.0;
        rot.c2 = 0.0;
        rot.c3 = 1.0;
        rot.c4 = 0.0;
        rot.d1 = 0.0;
        rot.d2 = 0.0;
        rot.d3 = 0.0;
        rot.d4 = 1.0;
        paVar11 = aiMatrix4x4t<double>::Rotation(dVar23 / (double)(uVar20 & 0xffffffff),&axis,&rot);
        temp.a1 = 1.0;
        temp.a2 = 0.0;
        temp.a3 = 0.0;
        temp.a4 = dVar4;
        temp.b1._0_4_ = 0;
        temp.b1._4_4_ = 0;
        temp.b2._0_4_ = 0;
        temp.b2._4_4_ = 0x3ff00000;
        temp.b3 = 0.0;
        temp.b4 = dVar5;
        temp.c1 = 0.0;
        temp.c2 = 0.0;
        temp.c3 = 1.0;
        temp.c4 = dVar6;
        temp.d1 = 0.0;
        temp.d2 = 0.0;
        temp.d3 = 0.0;
        temp.d4 = 1.0;
        aiMatrix4x4t<double>::operator*=(&temp,paVar11);
        paVar11 = &temp;
        paVar16 = &trafo;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          paVar16->a1 = paVar11->a1;
          paVar11 = (aiMatrix4x4t<double> *)((long)paVar11 + (ulong)bVar22 * -0x10 + 8);
          paVar16 = (aiMatrix4x4t<double> *)((long)paVar16 + (ulong)bVar22 * -0x10 + 8);
        }
        aiMatrix4x4t<double>::operator*=(&trafo,&local_1d0);
        pIVar15 = &trafo;
        pIVar17 = &rot;
        for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
          pIVar17->a1 = pIVar15->a1;
          pIVar15 = (IfcMatrix4 *)((long)pIVar15 + (ulong)bVar22 * -0x10 + 8);
          pIVar17 = (IfcMatrix4 *)((long)pIVar17 + (ulong)bVar22 * -0x10 + 8);
        }
        lVar13 = 0;
        uVar10 = uVar9;
        while (bVar21 = uVar10 != 0, uVar10 = uVar10 - 1, bVar21) {
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::insert
                    (&result->mVerts,
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,4,
                     (value_type *)
                     ((long)&(meshout.mVerts.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->x + lVar13));
          lVar13 = lVar13 + 0x18;
        }
        uVar10 = uVar9 * 0x60;
        local_328 = uVar10 ^ 0xffffffffffffffe8;
        local_348 = 0;
        lVar13 = 0x48;
        for (iVar12 = 0; iVar12 != (int)uVar20; iVar12 = iVar12 + 1) {
          lVar19 = lVar13;
          for (uVar18 = 1; uVar18 - uVar9 != 1; uVar18 = uVar18 + 1) {
            trafo.a1 = (double)CONCAT44(trafo.a1._4_4_,4);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (this_00,(uint *)&trafo);
            paVar2 = (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            trafo.a3 = *(double *)((long)&paVar2->z + lVar19);
            pdVar1 = (double *)((long)&paVar2->x + lVar19);
            trafo.a1 = *pdVar1;
            trafo.a2 = pdVar1[1];
            lVar14 = local_348 + (uVar18 % uVar9) * 4 + 3;
            temp.a3 = paVar2[lVar14].z;
            temp.a1 = paVar2[lVar14].x;
            temp.a2 = paVar2[lVar14].y;
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&result->mVerts,(value_type *)&trafo);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&result->mVerts,(value_type *)&temp);
            ::operator*(&rot,(aiVector3t<double> *)&temp);
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            emplace_back<aiVector3t<double>>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                       &local_150);
            ::operator*(&rot,(aiVector3t<double> *)&trafo);
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            emplace_back<aiVector3t<double>>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                       &local_150);
            lVar19 = lVar19 + 0x60;
          }
          local_348 = local_348 + uVar9 * 4;
          local_328 = local_328 + uVar10;
          lVar13 = lVar13 + uVar10;
        }
        __first._M_current =
             (result->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                  (&result->mVerts,__first,__first._M_current + uVar9 * 4);
        if (bVar7) {
          lVar13 = uVar9 + 1;
          while (lVar13 = lVar13 + -1, lVar13 != 0) {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&result->mVerts,
                       (value_type *)
                       ((long)&((result->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->x + local_328));
            local_328 = local_328 - 0x60;
          }
          lVar13 = 0;
          uVar20 = uVar9;
          while (bVar7 = uVar20 != 0, uVar20 = uVar20 - 1, bVar7) {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&result->mVerts,
                       (value_type *)
                       ((long)&((result->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->x + lVar13));
            lVar13 = lVar13 + 0x60;
          }
          trafo.a1 = (double)CONCAT44(trafo.a1._4_4_,(int)uVar9);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,(uint *)&trafo);
          trafo.a1 = (double)CONCAT44(trafo.a1._4_4_,(int)uVar9);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,(uint *)&trafo);
        }
        trafo.a1 = 1.0;
        trafo.a2 = 0.0;
        trafo.a3 = 0.0;
        trafo.a4 = 0.0;
        trafo.b1 = 0.0;
        trafo.b2 = 1.0;
        trafo.b3 = 0.0;
        trafo.b4 = 0.0;
        trafo.c1 = 0.0;
        trafo.c2 = 0.0;
        trafo.c3 = 1.0;
        trafo.c4 = 0.0;
        trafo.d1 = 0.0;
        trafo.d2 = 0.0;
        trafo.d3 = 0.0;
        trafo.d4 = 1.0;
        in_00 = STEP::Lazy::operator_cast_to_IfcAxis2Placement3D_
                          ((Lazy *)&(solid->super_IfcSweptAreaSolid).Position);
        ConvertAxisPlacement(&trafo,in_00);
        TempMesh::Transform(result,&trafo);
        LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4dbc17);
      }
      else if (2 < uVar9 && bVar7) {
        TempMesh::operator=(result,&meshout);
      }
    }
  }
  TempMesh::~TempMesh(&meshout);
  return;
}

Assistant:

void ProcessRevolvedAreaSolid(const Schema_2x3::IfcRevolvedAreaSolid& solid, TempMesh& result, ConversionData& conv)
{
    TempMesh meshout;

    // first read the profile description
    if(!ProcessProfile(*solid.SweptArea,meshout,conv) || meshout.mVerts.size()<=1) {
        return;
    }

    IfcVector3 axis, pos;
    ConvertAxisPlacement(axis,pos,solid.Axis);

    IfcMatrix4 tb0,tb1;
    IfcMatrix4::Translation(pos,tb0);
    IfcMatrix4::Translation(-pos,tb1);

    const std::vector<IfcVector3>& in = meshout.mVerts;
    const size_t size=in.size();

    bool has_area = solid.SweptArea->ProfileType == "AREA" && size>2;
    const IfcFloat max_angle = solid.Angle*conv.angle_scale;
    if(std::fabs(max_angle) < 1e-3) {
        if(has_area) {
            result = meshout;
        }
        return;
    }

    const unsigned int cnt_segments = std::max(2u,static_cast<unsigned int>(conv.settings.cylindricalTessellation * std::fabs(max_angle)/AI_MATH_HALF_PI_F));
    const IfcFloat delta = max_angle/cnt_segments;

    has_area = has_area && std::fabs(max_angle) < AI_MATH_TWO_PI_F*0.99;

    result.mVerts.reserve(size*((cnt_segments+1)*4+(has_area?2:0)));
    result.mVertcnt.reserve(size*cnt_segments+2);

    IfcMatrix4 rot;
    rot = tb0 * IfcMatrix4::Rotation(delta,axis,rot) * tb1;

    size_t base = 0;
    std::vector<IfcVector3>& out = result.mVerts;

    // dummy data to simplify later processing
    for(size_t i = 0; i < size; ++i) {
        out.insert(out.end(),4,in[i]);
    }

    for(unsigned int seg = 0; seg < cnt_segments; ++seg) {
        for(size_t i = 0; i < size; ++i) {
            const size_t next = (i+1)%size;

            result.mVertcnt.push_back(4);
            const IfcVector3 base_0 = out[base+i*4+3],base_1 = out[base+next*4+3];

            out.push_back(base_0);
            out.push_back(base_1);
            out.push_back(rot*base_1);
            out.push_back(rot*base_0);
        }
        base += size*4;
    }

    out.erase(out.begin(),out.begin()+size*4);

    if(has_area) {
        // leave the triangulation of the profile area to the ear cutting
        // implementation in aiProcess_Triangulate - for now we just
        // feed in two huge polygons.
        base -= size*8;
        for(size_t i = size; i--; ) {
            out.push_back(out[base+i*4+3]);
        }
        for(size_t i = 0; i < size; ++i ) {
            out.push_back(out[i*4]);
        }
        result.mVertcnt.push_back(static_cast<unsigned int>(size));
        result.mVertcnt.push_back(static_cast<unsigned int>(size));
    }

    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    result.Transform(trafo);
    IFCImporter::LogDebug("generate mesh procedurally by radial extrusion (IfcRevolvedAreaSolid)");
}